

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_writer.cpp
# Opt level: O0

ImageWriter * dpfb::ImageWriter::get(char *name)

{
  ImageWriterError *this;
  string local_38 [32];
  ImageWriter *local_18;
  ImageWriter *writer;
  char *name_local;
  
  writer = (ImageWriter *)name;
  local_18 = find(name);
  if (local_18 != (ImageWriter *)0x0) {
    return local_18;
  }
  this = (ImageWriterError *)__cxa_allocate_exception(0x10);
  str::format_abi_cxx11_((char *)local_38,"No such image writer: \"%s\"",writer);
  ImageWriterError::runtime_error(this,local_38);
  __cxa_throw(this,&ImageWriterError::typeinfo,ImageWriterError::~ImageWriterError);
}

Assistant:

const ImageWriter& ImageWriter::get(const char* name)
{
    if (const auto* writer = find(name))
        return *writer;

    throw ImageWriterError(
        str::format("No such image writer: \"%s\"", name));
}